

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fragment.cpp
# Opt level: O2

size_t __thiscall pstore::repo::fragment::size_bytes(fragment *this)

{
  value_type vVar1;
  uint uVar2;
  const_reference pvVar3;
  long lVar4;
  not_null<std::aligned_storage<16UL,_8UL>::type_*> local_48;
  long *local_40;
  dispatcher_buffer buffer;
  
  if ((this->arr_).sa_.bitmap_ != 0) {
    pvVar3 = section_sparray<unsigned_long>::back(&this->arr_);
    vVar1 = *pvVar3;
    buffer._0_4_ = (this->arr_).sa_.bitmap_;
    uVar2 = sparse_array<unsigned_long,_unsigned_int>::indices::back((indices *)&buffer.__align);
    local_48.ptr_ = &buffer;
    gsl::not_null<std::aligned_storage<16UL,_8UL>::type_*>::ensure_invariant(&local_48);
    anon_unknown.dwarf_116d75::make_dispatcher
              ((anon_unknown_dwarf_116d75 *)&local_40,this,(section_kind)uVar2,local_48);
    lVar4 = (**(code **)(*local_40 + 0x10))();
    return lVar4 + vVar1;
  }
  return 0x20;
}

Assistant:

std::size_t fragment::size_bytes () const {
    if (arr_.size () == 0) {
        return sizeof (*this);
    }
    auto const last_offset = arr_.back ();
    auto const last_section_kind = static_cast<section_kind> (arr_.get_indices ().back ());
    dispatcher_buffer buffer;
    auto const last_section_size =
        make_dispatcher (*this, last_section_kind, &buffer)->size_bytes ();
    return last_offset + last_section_size;
}